

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall specialOps_degC_Test::TestBody(specialOps_degC_Test *this)

{
  uint extraout_EAX;
  char *message;
  double in_XMM1_Qa;
  AssertionResult gtest_ar;
  precise_unit res;
  AssertHelper local_50;
  precise_unit local_48;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  double local_28;
  precise_unit local_20;
  
  local_28 = units::detail::power_const<double>(1.0,2);
  units::detail::unit_data::pow((unit_data *)(units::precise::degC + 8),local_28,in_XMM1_Qa);
  local_20._8_8_ = ZEXT48(extraout_EAX);
  local_20.multiplier_ = local_28;
  local_48 = units::root(&local_20,2);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            (local_38,"root(res, 2)","precise::degC",&local_48,(precise_unit *)units::precise::degC)
  ;
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x357,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_48.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_48.multiplier_ + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST(specialOps, degC)
{
    auto res = precise::degC.pow(2);
    EXPECT_EQ(root(res, 2), precise::degC);
}